

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O3

Vec_Int_t * findHintOutputs(Abc_Ntk_t *pNtk)

{
  Vec_Int_t *p;
  Vec_Ptr_t *pVVar1;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  p = (Vec_Int_t *)calloc(1,0x10);
  pVVar1 = pNtk->vPos;
  pVVar3 = (Vec_Int_t *)0x0;
  pVVar4 = pVVar3;
  if (0 < pVVar1->nSize) {
    lVar5 = 0;
    do {
      pcVar2 = Abc_ObjName((Abc_Obj_t *)pVVar1->pArray[lVar5]);
      pcVar2 = strstr(pcVar2,"hint_");
      if (pcVar2 != (char *)0x0) {
        Vec_IntPush(p,(int)lVar5);
        pVVar3 = (Vec_Int_t *)(ulong)((int)pVVar3 + 1);
      }
      lVar5 = lVar5 + 1;
      pVVar1 = pNtk->vPos;
    } while (lVar5 < pVVar1->nSize);
    pVVar4 = p;
    if ((int)pVVar3 == 0) {
      pVVar4 = (Vec_Int_t *)0x0;
    }
  }
  return pVVar4;
}

Assistant:

Vec_Int_t *findHintOutputs(Abc_Ntk_t *pNtk)
{
	int i, numElementPush = 0;
	Abc_Obj_t *pNode;
	Vec_Int_t *vHintPoIntdex;

	vHintPoIntdex = Vec_IntAlloc(0);
	Abc_NtkForEachPo( pNtk, pNode, i )
	{
		if( strstr( Abc_ObjName( pNode ), "hint_" ) != NULL )
		{
			Vec_IntPush( vHintPoIntdex, i );
			numElementPush++;
		}
	}	
	
	if( numElementPush == 0 )
		return NULL;
	else
		return vHintPoIntdex;
}